

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall CLIntercept::dumpProgramBinary(CLIntercept *this,cl_program program)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  size_t sVar5;
  cl_int cVar6;
  size_t i;
  mapped_type *pmVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  ulong uVar11;
  void *pvVar12;
  size_t i_2;
  ulong uVar13;
  size_t i_1;
  ulong uVar14;
  size_t sVar15;
  double __x;
  size_t numDevices;
  cl_device_type deviceType;
  cl_program program_local;
  void *local_1a8;
  void *local_1a0;
  string fileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  char numberString [256];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  program_local = program;
  std::mutex::lock(&this->m_Mutex);
  pmVar7 = std::
           map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
           ::operator[](&this->m_ProgramInfoMap,&program_local);
  fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
  fileName._M_string_length = 0;
  fileName.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)numberString,sc_DumpDirectoryName,(allocator *)&local_178);
  OS::Services_Common::GetDumpDirectoryName
            (&(this->m_OS).super_Services_Common,(string *)numberString,&fileName);
  std::__cxx11::string::~string((string *)numberString);
  memset(numberString,0,0x100);
  if ((this->m_Config).OmitProgramNumber == true) {
    uVar1 = pmVar7->CompileCount;
    uVar2 = (uint)pmVar7->ProgramHash;
    uVar3 = (uint)pmVar7->OptionsHash;
    pcVar4 = "$%08X_%04u_%08X";
  }
  else {
    uVar1 = (uint)pmVar7->ProgramHash;
    uVar2 = pmVar7->ProgramNumber;
    uVar3 = pmVar7->CompileCount;
    pcVar4 = "$%04u_%08X_%04u_%08X";
  }
  snprintf(numberString,0x100,pcVar4 + 1,(ulong)uVar2,(ulong)uVar1,(ulong)uVar3);
  std::__cxx11::string::append((char *)&fileName);
  std::__cxx11::string::append((char *)&fileName);
  OS::Services_Common::MakeDumpDirectories(&(this->m_OS).super_Services_Common,&fileName);
  numDevices = 0;
  cVar6 = (*(this->m_Dispatch).clGetProgramInfo)(program_local,0x1163,0,(void *)0x0,&numDevices);
  if (cVar6 == 0) {
    uVar14 = numDevices >> 3;
    uVar13 = numDevices & 0xfffffffffffffff8;
    numDevices = uVar14;
    pvVar8 = operator_new__(uVar13);
    pvVar9 = operator_new__(uVar13);
    pvVar10 = operator_new__(uVar13);
    for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
      *(undefined8 *)((long)pvVar9 + uVar11 * 8) = 0;
    }
    cVar6 = (*(this->m_Dispatch).clGetProgramInfo)(program_local,0x1163,uVar13,pvVar8,(size_t *)0x0)
    ;
    if (cVar6 == 0) {
      cVar6 = (*(this->m_Dispatch).clGetProgramInfo)
                        (program_local,0x1165,numDevices << 3,pvVar10,(size_t *)0x0);
      sVar5 = numDevices;
      if (cVar6 == 0) {
        for (sVar15 = 0; sVar5 != sVar15; sVar15 = sVar15 + 1) {
          pvVar12 = operator_new__(*(ulong *)((long)pvVar10 + sVar15 * 8));
          *(void **)((long)pvVar9 + sVar15 * 8) = pvVar12;
        }
        cVar6 = (*(this->m_Dispatch).clGetProgramInfo)
                          (program_local,0x1166,sVar5 << 3,pvVar9,(size_t *)0x0);
        local_1a8 = pvVar10;
        local_1a0 = pvVar8;
        if (cVar6 == 0) {
          for (uVar11 = 0; uVar11 < numDevices; uVar11 = uVar11 + 1) {
            deviceType = 1;
            (*(this->m_Dispatch).clGetDeviceInfo)
                      (*(cl_device_id *)((long)local_1a0 + uVar11 * 8),0x1000,8,&deviceType,
                       (size_t *)0x0);
            std::__cxx11::string::string((string *)numberString,(string *)&fileName);
            if ((deviceType & 2) != 0) {
              std::__cxx11::string::append(numberString);
            }
            if ((deviceType & 4) != 0) {
              std::__cxx11::string::append(numberString);
            }
            if ((deviceType & 8) != 0) {
              std::__cxx11::string::append(numberString);
            }
            if ((deviceType & 0x10) != 0) {
              std::__cxx11::string::append(numberString);
            }
            std::__cxx11::string::append(numberString);
            std::operator+(&local_50,"Dumping program binary to file: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           numberString);
            std::operator+(&local_178,&local_50,"\n");
            log(this,__x);
            std::__cxx11::string::~string((string *)&local_178);
            std::__cxx11::string::~string((string *)&local_50);
            dumpMemoryToFile(this,(string *)numberString,false,*(void **)((long)pvVar9 + uVar11 * 8)
                             ,*(size_t *)((long)local_1a8 + uVar11 * 8));
            std::__cxx11::string::~string((string *)numberString);
          }
        }
        pvVar8 = local_1a0;
        pvVar10 = local_1a8;
        for (uVar11 = 0; uVar11 < numDevices; uVar11 = uVar11 + 1) {
          pvVar12 = *(void **)((long)pvVar9 + uVar11 * 8);
          if (pvVar12 != (void *)0x0) {
            operator_delete__(pvVar12);
          }
          *(undefined8 *)((long)pvVar9 + uVar11 * 8) = 0;
        }
      }
    }
    operator_delete__(pvVar8);
    operator_delete__(pvVar9);
    operator_delete__(pvVar10);
  }
  std::__cxx11::string::~string((string *)&fileName);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void CLIntercept::dumpProgramBinary(
    const cl_program program )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    const SProgramInfo& programInfo = m_ProgramInfoMap[ program ];

    std::string     fileName;

    // Get the dump directory name.
    {
        OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileName );
    }
    // Make the file name.  It will have the form:
    //   CLI_<program number>_<program hash>_<compile count>_<options hash>
    // Leave off the extension for now.
    {
        char    numberString[256] = "";

        if( config().OmitProgramNumber )
        {
            CLI_SPRINTF( numberString, 256, "%08X_%04u_%08X",
                (unsigned int)programInfo.ProgramHash,
                programInfo.CompileCount,
                (unsigned int)programInfo.OptionsHash );
        }
        else
        {
            CLI_SPRINTF( numberString, 256, "%04u_%08X_%04u_%08X",
                programInfo.ProgramNumber,
                (unsigned int)programInfo.ProgramHash,
                programInfo.CompileCount,
                (unsigned int)programInfo.OptionsHash );
        }

        fileName += "/CLI_";
        fileName += numberString;
    }
    // Now make directories as appropriate.
    {
        OS().MakeDumpDirectories( fileName );
    }

    cl_int  errorCode = CL_SUCCESS;

    size_t  numDevices = 0;

    if( errorCode == CL_SUCCESS )
    {
        // Get all of the devices associated with this program.
        errorCode = dispatch().clGetProgramInfo(
            program,
            CL_PROGRAM_DEVICES,
            0,
            NULL,
            &numDevices );
    }

    cl_device_id*   devices = NULL;
    char**          programBinaries = NULL;
    size_t*         programBinarySizes = NULL;

    if( errorCode == CL_SUCCESS )
    {
        numDevices /= sizeof( cl_device_id );

        devices = new cl_device_id[ numDevices ];
        programBinaries = new char*[ numDevices ];
        programBinarySizes = new size_t[ numDevices ];

        if( ( devices == NULL ) ||
            ( programBinaries == NULL ) ||
            ( programBinarySizes == NULL ) )
        {
            CLI_ASSERT( 0 );
            errorCode = CL_OUT_OF_HOST_MEMORY;
        }
    }

    if( errorCode == CL_SUCCESS )
    {
        for( size_t i = 0; i < numDevices; i++ )
        {
            programBinaries[i] = NULL;
        }

        errorCode = dispatch().clGetProgramInfo(
            program,
            CL_PROGRAM_DEVICES,
            numDevices * sizeof( cl_device_id ),
            devices,
            NULL );
    }

    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clGetProgramInfo(
            program,
            CL_PROGRAM_BINARY_SIZES,
            numDevices * sizeof( size_t ),
            programBinarySizes,
            NULL );
    }

    if( errorCode == CL_SUCCESS )
    {
        for( size_t i = 0; i < numDevices; i++ )
        {
            programBinaries[ i ] = new char[ programBinarySizes[ i ] ];
            if( programBinaries[ i ] == NULL )
            {
                errorCode = CL_OUT_OF_HOST_MEMORY;
                break;
            }
        }

        if( errorCode == CL_SUCCESS )
        {
            errorCode = dispatch().clGetProgramInfo(
                program,
                CL_PROGRAM_BINARIES,
                numDevices * sizeof( char* ),
                programBinaries,
                NULL );
        }

        if( errorCode == CL_SUCCESS )
        {
            for( size_t i = 0; i < numDevices; i++ )
            {
                cl_device_type  deviceType = CL_DEVICE_TYPE_DEFAULT;

                // It's OK if this fails.  If it does, it just
                // means that our output file won't have a device
                // type.
                dispatch().clGetDeviceInfo(
                    devices[ i ],
                    CL_DEVICE_TYPE,
                    sizeof( deviceType ),
                    &deviceType,
                    NULL );

                std::string outputFileName = fileName;

                if( deviceType & CL_DEVICE_TYPE_CPU )
                {
                    outputFileName += "_CPU";
                }
                if( deviceType & CL_DEVICE_TYPE_GPU )
                {
                    outputFileName += "_GPU";
                }
                if( deviceType & CL_DEVICE_TYPE_ACCELERATOR )
                {
                    outputFileName += "_ACC";
                }
                if( deviceType & CL_DEVICE_TYPE_CUSTOM )
                {
                    outputFileName += "_CUSTOM";
                }

                outputFileName += ".bin";

                log( "Dumping program binary to file: " + outputFileName + "\n" );
                dumpMemoryToFile(
                    outputFileName,
                    false,
                    programBinaries[ i ],
                    programBinarySizes[ i ] );
            }
        }

        for( size_t i = 0; i < numDevices; i++ )
        {
            delete [] programBinaries[ i ];
            programBinaries[ i ] = NULL;
        }
    }

    delete [] devices;
    devices = NULL;

    delete [] programBinaries;
    programBinaries = NULL;

    delete [] programBinarySizes;
    programBinarySizes = NULL;
}